

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_countChar32_63(UChar *s,int32_t length)

{
  UChar *pUVar1;
  int local_20;
  int32_t iStack_1c;
  UChar c;
  int32_t count;
  int32_t length_local;
  UChar *s_local;
  
  if ((s == (UChar *)0x0) || (length < -1)) {
    s_local._4_4_ = 0;
  }
  else {
    local_20 = 0;
    iStack_1c = length;
    pUVar1 = s;
    _count = s;
    if (length < 0) {
      while( true ) {
        _count = pUVar1;
        pUVar1 = _count + 1;
        if (*_count == L'\0') break;
        local_20 = local_20 + 1;
        if (((*_count & 0xfc00U) == 0xd800) && ((*pUVar1 & 0xfc00U) == 0xdc00)) {
          pUVar1 = _count + 2;
        }
      }
    }
    else {
      while (0 < iStack_1c) {
        local_20 = local_20 + 1;
        if ((((*_count & 0xfc00U) == 0xd800) && (1 < iStack_1c)) &&
           ((_count[1] & 0xfc00U) == 0xdc00)) {
          _count = _count + 2;
          iStack_1c = iStack_1c + -2;
        }
        else {
          _count = _count + 1;
          iStack_1c = iStack_1c + -1;
        }
      }
    }
    s_local._4_4_ = local_20;
  }
  return s_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_countChar32(const UChar *s, int32_t length) {
    int32_t count;

    if(s==NULL || length<-1) {
        return 0;
    }

    count=0;
    if(length>=0) {
        while(length>0) {
            ++count;
            if(U16_IS_LEAD(*s) && length>=2 && U16_IS_TRAIL(*(s+1))) {
                s+=2;
                length-=2;
            } else {
                ++s;
                --length;
            }
        }
    } else /* length==-1 */ {
        UChar c;

        for(;;) {
            if((c=*s++)==0) {
                break;
            }
            ++count;

            /*
             * sufficient to look ahead one because of UTF-16;
             * safe to look ahead one because at worst that would be the terminating NUL
             */
            if(U16_IS_LEAD(c) && U16_IS_TRAIL(*s)) {
                ++s;
            }
        }
    }
    return count;
}